

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O3

avl_node * avl_search_greater(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  int iVar1;
  avl_node *paVar2;
  long lVar3;
  avl_node *node_00;
  
  paVar2 = tree->root;
  if (tree->root == (avl_node *)0x0) {
    node_00 = (avl_node *)0x0;
  }
  else {
    do {
      node_00 = paVar2;
      iVar1 = (*func)(node_00,node,tree->aux);
      lVar3 = 8;
      if ((iVar1 < 1) && (lVar3 = 0x10, -1 < iVar1)) {
        return node_00;
      }
      paVar2 = *(avl_node **)((long)&node_00->parent + lVar3);
    } while (paVar2 != (avl_node *)0x0);
    iVar1 = (*func)(node_00,node,tree->aux);
    if (iVar1 < 1) {
      paVar2 = avl_next(node_00);
      return paVar2;
    }
  }
  return node_00;
}

Assistant:

struct avl_node* avl_search_greater(struct avl_tree *tree,
                                    struct avl_node *node,
                                    avl_cmp_func *func)
// if an exact match does not exist,
// return smallest node greater than NODE
{
    struct avl_node *p = tree->root;
    struct avl_node *pp = NULL;
    int cmp;

    while(p)
    {
        cmp = func(p, node, tree->aux);
        pp = p;

        if (cmp > 0) {
            p = p->left;
        }else if (cmp < 0){
            p = p->right;
        }else {
            // search success
            return p;
        }
    }

    if (!pp) {
        return pp;
    }

    cmp = func(pp, node, tree->aux);
    if (cmp > 0) {
        return pp;
    }else{
        return avl_next(pp);
    }
}